

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O3

void __thiscall
flatbuffers::rust::RustGenerator::GenRootTableFuncs(RustGenerator *this,StructDef *struct_def)

{
  IdlNamer *pIVar1;
  CodeWriter *this_00;
  mapped_type *pmVar2;
  long *plVar3;
  size_type *psVar4;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  key_type local_c10;
  long *local_bf0 [2];
  long local_be0 [2];
  string local_bd0;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (((this->super_BaseGenerator).parser_)->root_struct_def_ != (StructDef *)0x0) {
    paVar6 = &local_c10.field_2;
    local_c10._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c10,"STRUCT_TY","");
    pIVar1 = &this->namer_;
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(local_bf0,pIVar1,struct_def);
    this_00 = &this->code_;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,&local_c10);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    if (local_bf0[0] != local_be0) {
      operator_delete(local_bf0[0],local_be0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c10._M_dataplus._M_p != paVar6) {
      operator_delete(local_c10._M_dataplus._M_p,local_c10.field_2._M_allocated_capacity + 1);
    }
    local_c10._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c10,"STRUCT_FN","");
    (*(pIVar1->super_Namer)._vptr_Namer[6])(local_bf0,pIVar1,struct_def);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,&local_c10);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    if (local_bf0[0] != local_be0) {
      operator_delete(local_bf0[0],local_be0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c10._M_dataplus._M_p != paVar6) {
      operator_delete(local_c10._M_dataplus._M_p,local_c10.field_2._M_allocated_capacity + 1);
    }
    local_c10._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c10,"STRUCT_CONST","");
    (*(this->namer_).super_Namer._vptr_Namer[0x14])
              (local_bf0,pIVar1,struct_def,(ulong)(this->namer_).super_Namer.config_.constants);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,&local_c10);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    if (local_bf0[0] != local_be0) {
      operator_delete(local_bf0[0],local_be0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c10._M_dataplus._M_p != paVar6) {
      operator_delete(local_c10._M_dataplus._M_p,local_c10.field_2._M_allocated_capacity + 1);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"#[inline]","");
    CodeWriter::operator+=(this_00,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"/// Verifies that a buffer of bytes contains a `{{STRUCT_TY}}`",
               "");
    CodeWriter::operator+=(this_00,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"/// and returns it.","");
    CodeWriter::operator+=(this_00,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"/// Note that verification is still experimental and may not",
               "");
    CodeWriter::operator+=(this_00,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"/// catch every error, or be maximally performant. For the","")
    ;
    CodeWriter::operator+=(this_00,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"/// previous, unchecked, behavior use","");
    CodeWriter::operator+=(this_00,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"/// `root_as_{{STRUCT_FN}}_unchecked`.","");
    CodeWriter::operator+=(this_00,&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,
               "pub fn root_as_{{STRUCT_FN}}(buf: &[u8]) -> Result<{{STRUCT_TY}}, flatbuffers::InvalidFlatbuffer> {"
               ,"");
    CodeWriter::operator+=(this_00,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d0,"  flatbuffers::root::<{{STRUCT_TY}}>(buf)","");
    CodeWriter::operator+=(this_00,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"}","");
    CodeWriter::operator+=(this_00,&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"#[inline]","");
    CodeWriter::operator+=(this_00,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,"/// Verifies that a buffer of bytes contains a size prefixed",
               "");
    CodeWriter::operator+=(this_00,&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,"/// `{{STRUCT_TY}}` and returns it.","");
    CodeWriter::operator+=(this_00,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_270,"/// Note that verification is still experimental and may not",
               "");
    CodeWriter::operator+=(this_00,&local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_290,"/// catch every error, or be maximally performant. For the","")
    ;
    CodeWriter::operator+=(this_00,&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,"/// previous, unchecked, behavior use","");
    CodeWriter::operator+=(this_00,&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d0,"/// `size_prefixed_root_as_{{STRUCT_FN}}_unchecked`.","");
    CodeWriter::operator+=(this_00,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2f0,
               "pub fn size_prefixed_root_as_{{STRUCT_FN}}(buf: &[u8]) -> Result<{{STRUCT_TY}}, flatbuffers::InvalidFlatbuffer> {"
               ,"");
    CodeWriter::operator+=(this_00,&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_310,"  flatbuffers::size_prefixed_root::<{{STRUCT_TY}}>(buf)","");
    CodeWriter::operator+=(this_00,&local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"}","");
    CodeWriter::operator+=(this_00,&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"#[inline]","");
    CodeWriter::operator+=(this_00,&local_350);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_370,"/// Verifies, with the given options, that a buffer of bytes",
               "");
    CodeWriter::operator+=(this_00,&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_390,"/// contains a `{{STRUCT_TY}}` and returns it.","");
    CodeWriter::operator+=(this_00,&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3b0,"/// Note that verification is still experimental and may not",
               "");
    CodeWriter::operator+=(this_00,&local_3b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3d0,"/// catch every error, or be maximally performant. For the","")
    ;
    CodeWriter::operator+=(this_00,&local_3d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
    }
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3f0,"/// previous, unchecked, behavior use","");
    CodeWriter::operator+=(this_00,&local_3f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_410,"/// `root_as_{{STRUCT_FN}}_unchecked`.","");
    CodeWriter::operator+=(this_00,&local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_430,"pub fn root_as_{{STRUCT_FN}}_with_opts<\'b, \'o>(","");
    CodeWriter::operator+=(this_00,&local_430);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_450,"  opts: &\'o flatbuffers::VerifierOptions,","");
    CodeWriter::operator+=(this_00,&local_450);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"  buf: &\'b [u8],","");
    CodeWriter::operator+=(this_00,&local_470);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
    }
    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_490,
               ") -> Result<{{STRUCT_TY}}<\'b>, flatbuffers::InvalidFlatbuffer> {","");
    CodeWriter::operator+=(this_00,&local_490);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
    }
    local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4b0,"  flatbuffers::root_with_opts::<{{STRUCT_TY}}<\'b>>(opts, buf)"
               ,"");
    CodeWriter::operator+=(this_00,&local_4b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
    }
    local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"}","");
    CodeWriter::operator+=(this_00,&local_4d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
    }
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"#[inline]","");
    CodeWriter::operator+=(this_00,&local_4f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
    }
    local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_510,
               "/// Verifies, with the given verifier options, that a buffer of","");
    CodeWriter::operator+=(this_00,&local_510);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_dataplus._M_p != &local_510.field_2) {
      operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
    }
    local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_530,"/// bytes contains a size prefixed `{{STRUCT_TY}}` and returns"
               ,"");
    CodeWriter::operator+=(this_00,&local_530);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_dataplus._M_p != &local_530.field_2) {
      operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
    }
    local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_550,
               "/// it. Note that verification is still experimental and may not","");
    CodeWriter::operator+=(this_00,&local_550);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._M_dataplus._M_p != &local_550.field_2) {
      operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
    }
    local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_570,"/// catch every error, or be maximally performant. For the","")
    ;
    CodeWriter::operator+=(this_00,&local_570);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570._M_dataplus._M_p != &local_570.field_2) {
      operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
    }
    local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_590,"/// previous, unchecked, behavior use","");
    CodeWriter::operator+=(this_00,&local_590);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
    }
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5b0,"/// `root_as_{{STRUCT_FN}}_unchecked`.","");
    CodeWriter::operator+=(this_00,&local_5b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
    local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5d0,
               "pub fn size_prefixed_root_as_{{STRUCT_FN}}_with_opts<\'b, \'o>(","");
    CodeWriter::operator+=(this_00,&local_5d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
      operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
    }
    local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5f0,"  opts: &\'o flatbuffers::VerifierOptions,","");
    CodeWriter::operator+=(this_00,&local_5f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
      operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
    }
    local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"  buf: &\'b [u8],","");
    CodeWriter::operator+=(this_00,&local_610);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._M_dataplus._M_p != &local_610.field_2) {
      operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
    }
    local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_630,
               ") -> Result<{{STRUCT_TY}}<\'b>, flatbuffers::InvalidFlatbuffer> {","");
    CodeWriter::operator+=(this_00,&local_630);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_630._M_dataplus._M_p != &local_630.field_2) {
      operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
    }
    local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_650,
               "  flatbuffers::size_prefixed_root_with_opts::<{{STRUCT_TY}}<\'b>>(opts, buf)","");
    CodeWriter::operator+=(this_00,&local_650);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._M_dataplus._M_p != &local_650.field_2) {
      operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
    }
    local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"}","");
    CodeWriter::operator+=(this_00,&local_670);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670._M_dataplus._M_p != &local_670.field_2) {
      operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
    }
    local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"#[inline]","");
    CodeWriter::operator+=(this_00,&local_690);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_690._M_dataplus._M_p != &local_690.field_2) {
      operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
    }
    local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_6b0,
               "/// Assumes, without verification, that a buffer of bytes contains a {{STRUCT_TY}} and returns it."
               ,"");
    CodeWriter::operator+=(this_00,&local_6b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
      operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
    }
    local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"/// # Safety","");
    CodeWriter::operator+=(this_00,&local_6d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
      operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
    }
    local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_6f0,
               "/// Callers must trust the given bytes do indeed contain a valid `{{STRUCT_TY}}`.",
               "");
    CodeWriter::operator+=(this_00,&local_6f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
      operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
    }
    local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_710,
               "pub unsafe fn root_as_{{STRUCT_FN}}_unchecked(buf: &[u8]) -> {{STRUCT_TY}} {","");
    CodeWriter::operator+=(this_00,&local_710);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_710._M_dataplus._M_p != &local_710.field_2) {
      operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
    }
    local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_730,"  flatbuffers::root_unchecked::<{{STRUCT_TY}}>(buf)","");
    CodeWriter::operator+=(this_00,&local_730);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_730._M_dataplus._M_p != &local_730.field_2) {
      operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
    }
    local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"}","");
    CodeWriter::operator+=(this_00,&local_750);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_750._M_dataplus._M_p != &local_750.field_2) {
      operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
    }
    local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"#[inline]","");
    CodeWriter::operator+=(this_00,&local_770);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_770._M_dataplus._M_p != &local_770.field_2) {
      operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
    }
    local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_790,
               "/// Assumes, without verification, that a buffer of bytes contains a size prefixed {{STRUCT_TY}} and returns it."
               ,"");
    CodeWriter::operator+=(this_00,&local_790);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_790._M_dataplus._M_p != &local_790.field_2) {
      operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
    }
    local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"/// # Safety","");
    CodeWriter::operator+=(this_00,&local_7b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
      operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
    }
    local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_7d0,
               "/// Callers must trust the given bytes do indeed contain a valid size prefixed `{{STRUCT_TY}}`."
               ,"");
    CodeWriter::operator+=(this_00,&local_7d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
      operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
    }
    local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_7f0,
               "pub unsafe fn size_prefixed_root_as_{{STRUCT_FN}}_unchecked(buf: &[u8]) -> {{STRUCT_TY}} {"
               ,"");
    CodeWriter::operator+=(this_00,&local_7f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
      operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
    }
    local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_810,
               "  flatbuffers::size_prefixed_root_unchecked::<{{STRUCT_TY}}>(buf)","");
    CodeWriter::operator+=(this_00,&local_810);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_810._M_dataplus._M_p != &local_810.field_2) {
      operator_delete(local_810._M_dataplus._M_p,local_810.field_2._M_allocated_capacity + 1);
    }
    local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_830,"}","");
    CodeWriter::operator+=(this_00,&local_830);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_830._M_dataplus._M_p != &local_830.field_2) {
      operator_delete(local_830._M_dataplus._M_p,local_830.field_2._M_allocated_capacity + 1);
    }
    if ((((this->super_BaseGenerator).parser_)->file_identifier_)._M_string_length != 0) {
      local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_850,"pub const {{STRUCT_CONST}}_IDENTIFIER: &str\\","");
      CodeWriter::operator+=(this_00,&local_850);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_850._M_dataplus._M_p != &local_850.field_2) {
        operator_delete(local_850._M_dataplus._M_p,local_850.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_c10," = \"",&((this->super_BaseGenerator).parser_)->file_identifier_);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_c10);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_bb0.field_2._M_allocated_capacity = *psVar4;
        local_bb0.field_2._8_8_ = plVar3[3];
        local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
      }
      else {
        local_bb0.field_2._M_allocated_capacity = *psVar4;
        local_bb0._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_bb0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      CodeWriter::operator+=(this_00,&local_bb0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
        operator_delete(local_bb0._M_dataplus._M_p,local_bb0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c10._M_dataplus._M_p != paVar6) {
        operator_delete(local_c10._M_dataplus._M_p,local_c10.field_2._M_allocated_capacity + 1);
      }
      local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_870,"");
      CodeWriter::operator+=(this_00,&local_870);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_870._M_dataplus._M_p != &local_870.field_2) {
        operator_delete(local_870._M_dataplus._M_p,local_870.field_2._M_allocated_capacity + 1);
      }
      local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_890,"#[inline]","");
      CodeWriter::operator+=(this_00,&local_890);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_890._M_dataplus._M_p != &local_890.field_2) {
        operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
      }
      local_8b0._M_dataplus._M_p = (pointer)&local_8b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_8b0,"pub fn {{STRUCT_FN}}_buffer_has_identifier\\","");
      CodeWriter::operator+=(this_00,&local_8b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
        operator_delete(local_8b0._M_dataplus._M_p,local_8b0.field_2._M_allocated_capacity + 1);
      }
      local_8d0._M_dataplus._M_p = (pointer)&local_8d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_8d0,"(buf: &[u8]) -> bool {","");
      CodeWriter::operator+=(this_00,&local_8d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d0._M_dataplus._M_p != &local_8d0.field_2) {
        operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
      }
      local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_8f0,"  flatbuffers::buffer_has_identifier(buf, \\","");
      CodeWriter::operator+=(this_00,&local_8f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
        operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
      }
      local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_910,"{{STRUCT_CONST}}_IDENTIFIER, false)","");
      CodeWriter::operator+=(this_00,&local_910);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_910._M_dataplus._M_p != &local_910.field_2) {
        operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
      }
      local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_930,"}","");
      CodeWriter::operator+=(this_00,&local_930);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_930._M_dataplus._M_p != &local_930.field_2) {
        operator_delete(local_930._M_dataplus._M_p,local_930.field_2._M_allocated_capacity + 1);
      }
      local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,"");
      CodeWriter::operator+=(this_00,&local_950);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_950._M_dataplus._M_p != &local_950.field_2) {
        operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
      }
      local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_970,"#[inline]","");
      CodeWriter::operator+=(this_00,&local_970);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_970._M_dataplus._M_p != &local_970.field_2) {
        operator_delete(local_970._M_dataplus._M_p,local_970.field_2._M_allocated_capacity + 1);
      }
      local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_990,"pub fn {{STRUCT_FN}}_size_prefixed\\","");
      CodeWriter::operator+=(this_00,&local_990);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_990._M_dataplus._M_p != &local_990.field_2) {
        operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
      }
      local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_9b0,"_buffer_has_identifier(buf: &[u8]) -> bool {","");
      CodeWriter::operator+=(this_00,&local_9b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
        operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
      }
      local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_9d0,"  flatbuffers::buffer_has_identifier(buf, \\","");
      CodeWriter::operator+=(this_00,&local_9d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
        operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
      }
      local_9f0._M_dataplus._M_p = (pointer)&local_9f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_9f0,"{{STRUCT_CONST}}_IDENTIFIER, true)","");
      CodeWriter::operator+=(this_00,&local_9f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
        operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
      }
      local_a10._M_dataplus._M_p = (pointer)&local_a10.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a10,"}","");
      CodeWriter::operator+=(this_00,&local_a10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
        operator_delete(local_a10._M_dataplus._M_p,local_a10.field_2._M_allocated_capacity + 1);
      }
      local_a30._M_dataplus._M_p = (pointer)&local_a30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a30,"");
      CodeWriter::operator+=(this_00,&local_a30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
        operator_delete(local_a30._M_dataplus._M_p,local_a30.field_2._M_allocated_capacity + 1);
      }
    }
    if ((((this->super_BaseGenerator).parser_)->file_extension_)._M_string_length != 0) {
      local_a50._M_dataplus._M_p = (pointer)&local_a50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a50,"pub const {{STRUCT_CONST}}_EXTENSION: &str = \\","");
      CodeWriter::operator+=(this_00,&local_a50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a50._M_dataplus._M_p != &local_a50.field_2) {
        operator_delete(local_a50._M_dataplus._M_p,local_a50.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_c10,"\"",&((this->super_BaseGenerator).parser_)->file_extension_);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_c10);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_bd0.field_2._M_allocated_capacity = *psVar4;
        local_bd0.field_2._8_8_ = plVar3[3];
        local_bd0._M_dataplus._M_p = (pointer)&local_bd0.field_2;
      }
      else {
        local_bd0.field_2._M_allocated_capacity = *psVar4;
        local_bd0._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_bd0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      CodeWriter::operator+=(this_00,&local_bd0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bd0._M_dataplus._M_p != &local_bd0.field_2) {
        operator_delete(local_bd0._M_dataplus._M_p,local_bd0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c10._M_dataplus._M_p != paVar6) {
        operator_delete(local_c10._M_dataplus._M_p,local_c10.field_2._M_allocated_capacity + 1);
      }
      local_a70._M_dataplus._M_p = (pointer)&local_a70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a70,"");
      CodeWriter::operator+=(this_00,&local_a70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
        operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
      }
    }
    local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"#[inline]","");
    CodeWriter::operator+=(this_00,&local_a90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
      operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
    }
    local_ab0._M_dataplus._M_p = (pointer)&local_ab0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_ab0,
               "pub fn finish_{{STRUCT_FN}}_buffer<\'a, \'b, A: flatbuffers::Allocator + \'a>(","");
    CodeWriter::operator+=(this_00,&local_ab0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ab0._M_dataplus._M_p != &local_ab0.field_2) {
      operator_delete(local_ab0._M_dataplus._M_p,local_ab0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_ad0,"    fbb: &\'b mut flatbuffers::FlatBufferBuilder<\'a, A>,","");
    CodeWriter::operator+=(this_00,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_af0,"    root: flatbuffers::WIPOffset<{{STRUCT_TY}}<\'a>>) {","");
    CodeWriter::operator+=(this_00,&local_af0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
      operator_delete(local_af0._M_dataplus._M_p,local_af0.field_2._M_allocated_capacity + 1);
    }
    if ((((this->super_BaseGenerator).parser_)->file_identifier_)._M_string_length == 0) {
      paVar6 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"  fbb.finish(root, None);","");
      CodeWriter::operator+=(this_00,&local_70);
      _Var5._M_p = local_70._M_dataplus._M_p;
    }
    else {
      paVar6 = &local_50.field_2;
      local_50._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"  fbb.finish(root, Some({{STRUCT_CONST}}_IDENTIFIER));","");
      CodeWriter::operator+=(this_00,&local_50);
      _Var5._M_p = local_50._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != paVar6) {
      operator_delete(_Var5._M_p,paVar6->_M_allocated_capacity + 1);
    }
    local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b10,"}","");
    CodeWriter::operator+=(this_00,&local_b10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
      operator_delete(local_b10._M_dataplus._M_p,local_b10.field_2._M_allocated_capacity + 1);
    }
    local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b30,"");
    CodeWriter::operator+=(this_00,&local_b30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
      operator_delete(local_b30._M_dataplus._M_p,local_b30.field_2._M_allocated_capacity + 1);
    }
    local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b50,"#[inline]","");
    CodeWriter::operator+=(this_00,&local_b50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
      operator_delete(local_b50._M_dataplus._M_p,local_b50.field_2._M_allocated_capacity + 1);
    }
    local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b70,
               "pub fn finish_size_prefixed_{{STRUCT_FN}}_buffer<\'a, \'b, A: flatbuffers::Allocator + \'a>(fbb: &\'b mut flatbuffers::FlatBufferBuilder<\'a, A>, root: flatbuffers::WIPOffset<{{STRUCT_TY}}<\'a>>) {"
               ,"");
    CodeWriter::operator+=(this_00,&local_b70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
      operator_delete(local_b70._M_dataplus._M_p,local_b70.field_2._M_allocated_capacity + 1);
    }
    if ((((this->super_BaseGenerator).parser_)->file_identifier_)._M_string_length == 0) {
      paVar6 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"  fbb.finish_size_prefixed(root, None);","");
      CodeWriter::operator+=(this_00,&local_b0);
      _Var5._M_p = local_b0._M_dataplus._M_p;
    }
    else {
      paVar6 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,
                 "  fbb.finish_size_prefixed(root, Some({{STRUCT_CONST}}_IDENTIFIER));","");
      CodeWriter::operator+=(this_00,&local_90);
      _Var5._M_p = local_90._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != paVar6) {
      operator_delete(_Var5._M_p,paVar6->_M_allocated_capacity + 1);
    }
    local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b90,"}","");
    CodeWriter::operator+=(this_00,&local_b90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
      operator_delete(local_b90._M_dataplus._M_p,local_b90.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  __assert_fail("parser_.root_struct_def_ && \"root table not defined\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                ,0x982,"void flatbuffers::rust::RustGenerator::GenRootTableFuncs(const StructDef &)"
               );
}

Assistant:

void GenRootTableFuncs(const StructDef &struct_def) {
    FLATBUFFERS_ASSERT(parser_.root_struct_def_ && "root table not defined");
    code_.SetValue("STRUCT_TY", namer_.Type(struct_def));
    code_.SetValue("STRUCT_FN", namer_.Function(struct_def));
    code_.SetValue("STRUCT_CONST", namer_.Constant(struct_def.name));

    // Default verifier root fns.
    code_ += "#[inline]";
    code_ += "/// Verifies that a buffer of bytes contains a `{{STRUCT_TY}}`";
    code_ += "/// and returns it.";
    code_ += "/// Note that verification is still experimental and may not";
    code_ += "/// catch every error, or be maximally performant. For the";
    code_ += "/// previous, unchecked, behavior use";
    code_ += "/// `root_as_{{STRUCT_FN}}_unchecked`.";
    code_ +=
        "pub fn root_as_{{STRUCT_FN}}(buf: &[u8]) "
        "-> Result<{{STRUCT_TY}}, flatbuffers::InvalidFlatbuffer> {";
    code_ += "  flatbuffers::root::<{{STRUCT_TY}}>(buf)";
    code_ += "}";
    code_ += "#[inline]";
    code_ += "/// Verifies that a buffer of bytes contains a size prefixed";
    code_ += "/// `{{STRUCT_TY}}` and returns it.";
    code_ += "/// Note that verification is still experimental and may not";
    code_ += "/// catch every error, or be maximally performant. For the";
    code_ += "/// previous, unchecked, behavior use";
    code_ += "/// `size_prefixed_root_as_{{STRUCT_FN}}_unchecked`.";
    code_ +=
        "pub fn size_prefixed_root_as_{{STRUCT_FN}}"
        "(buf: &[u8]) -> Result<{{STRUCT_TY}}, "
        "flatbuffers::InvalidFlatbuffer> {";
    code_ += "  flatbuffers::size_prefixed_root::<{{STRUCT_TY}}>(buf)";
    code_ += "}";
    // Verifier with options root fns.
    code_ += "#[inline]";
    code_ += "/// Verifies, with the given options, that a buffer of bytes";
    code_ += "/// contains a `{{STRUCT_TY}}` and returns it.";
    code_ += "/// Note that verification is still experimental and may not";
    code_ += "/// catch every error, or be maximally performant. For the";
    code_ += "/// previous, unchecked, behavior use";
    code_ += "/// `root_as_{{STRUCT_FN}}_unchecked`.";
    code_ += "pub fn root_as_{{STRUCT_FN}}_with_opts<'b, 'o>(";
    code_ += "  opts: &'o flatbuffers::VerifierOptions,";
    code_ += "  buf: &'b [u8],";
    code_ +=
        ") -> Result<{{STRUCT_TY}}<'b>, flatbuffers::InvalidFlatbuffer>"
        " {";
    code_ += "  flatbuffers::root_with_opts::<{{STRUCT_TY}}<'b>>(opts, buf)";
    code_ += "}";
    code_ += "#[inline]";
    code_ += "/// Verifies, with the given verifier options, that a buffer of";
    code_ += "/// bytes contains a size prefixed `{{STRUCT_TY}}` and returns";
    code_ += "/// it. Note that verification is still experimental and may not";
    code_ += "/// catch every error, or be maximally performant. For the";
    code_ += "/// previous, unchecked, behavior use";
    code_ += "/// `root_as_{{STRUCT_FN}}_unchecked`.";
    code_ +=
        "pub fn size_prefixed_root_as_{{STRUCT_FN}}_with_opts"
        "<'b, 'o>(";
    code_ += "  opts: &'o flatbuffers::VerifierOptions,";
    code_ += "  buf: &'b [u8],";
    code_ +=
        ") -> Result<{{STRUCT_TY}}<'b>, flatbuffers::InvalidFlatbuffer>"
        " {";
    code_ +=
        "  flatbuffers::size_prefixed_root_with_opts::<{{STRUCT_TY}}"
        "<'b>>(opts, buf)";
    code_ += "}";
    // Unchecked root fns.
    code_ += "#[inline]";
    code_ +=
        "/// Assumes, without verification, that a buffer of bytes "
        "contains a {{STRUCT_TY}} and returns it.";
    code_ += "/// # Safety";
    code_ +=
        "/// Callers must trust the given bytes do indeed contain a valid"
        " `{{STRUCT_TY}}`.";
    code_ +=
        "pub unsafe fn root_as_{{STRUCT_FN}}_unchecked"
        "(buf: &[u8]) -> {{STRUCT_TY}} {";
    code_ += "  flatbuffers::root_unchecked::<{{STRUCT_TY}}>(buf)";
    code_ += "}";
    code_ += "#[inline]";
    code_ +=
        "/// Assumes, without verification, that a buffer of bytes "
        "contains a size prefixed {{STRUCT_TY}} and returns it.";
    code_ += "/// # Safety";
    code_ +=
        "/// Callers must trust the given bytes do indeed contain a valid"
        " size prefixed `{{STRUCT_TY}}`.";
    code_ +=
        "pub unsafe fn size_prefixed_root_as_{{STRUCT_FN}}"
        "_unchecked(buf: &[u8]) -> {{STRUCT_TY}} {";
    code_ +=
        "  flatbuffers::size_prefixed_root_unchecked::<{{STRUCT_TY}}>"
        "(buf)";
    code_ += "}";

    if (parser_.file_identifier_.length()) {
      // Declare the identifier
      // (no lifetime needed as constants have static lifetimes by default)
      code_ += "pub const {{STRUCT_CONST}}_IDENTIFIER: &str\\";
      code_ += " = \"" + parser_.file_identifier_ + "\";";
      code_ += "";

      // Check if a buffer has the identifier.
      code_ += "#[inline]";
      code_ += "pub fn {{STRUCT_FN}}_buffer_has_identifier\\";
      code_ += "(buf: &[u8]) -> bool {";
      code_ += "  flatbuffers::buffer_has_identifier(buf, \\";
      code_ += "{{STRUCT_CONST}}_IDENTIFIER, false)";
      code_ += "}";
      code_ += "";
      code_ += "#[inline]";
      code_ += "pub fn {{STRUCT_FN}}_size_prefixed\\";
      code_ += "_buffer_has_identifier(buf: &[u8]) -> bool {";
      code_ += "  flatbuffers::buffer_has_identifier(buf, \\";
      code_ += "{{STRUCT_CONST}}_IDENTIFIER, true)";
      code_ += "}";
      code_ += "";
    }

    if (parser_.file_extension_.length()) {
      // Return the extension
      code_ += "pub const {{STRUCT_CONST}}_EXTENSION: &str = \\";
      code_ += "\"" + parser_.file_extension_ + "\";";
      code_ += "";
    }

    // Finish a buffer with a given root object:
    code_ += "#[inline]";
    code_ +=
        "pub fn finish_{{STRUCT_FN}}_buffer<'a, 'b, A: "
        "flatbuffers::Allocator + 'a>(";
    code_ += "    fbb: &'b mut flatbuffers::FlatBufferBuilder<'a, A>,";
    code_ += "    root: flatbuffers::WIPOffset<{{STRUCT_TY}}<'a>>) {";
    if (parser_.file_identifier_.length()) {
      code_ += "  fbb.finish(root, Some({{STRUCT_CONST}}_IDENTIFIER));";
    } else {
      code_ += "  fbb.finish(root, None);";
    }
    code_ += "}";
    code_ += "";
    code_ += "#[inline]";
    code_ +=
        "pub fn finish_size_prefixed_{{STRUCT_FN}}_buffer"
        "<'a, 'b, A: flatbuffers::Allocator + 'a>("
        "fbb: &'b mut flatbuffers::FlatBufferBuilder<'a, A>, "
        "root: flatbuffers::WIPOffset<{{STRUCT_TY}}<'a>>) {";
    if (parser_.file_identifier_.length()) {
      code_ +=
          "  fbb.finish_size_prefixed(root, "
          "Some({{STRUCT_CONST}}_IDENTIFIER));";
    } else {
      code_ += "  fbb.finish_size_prefixed(root, None);";
    }
    code_ += "}";
  }